

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

QString * QInputDialog::getText
                    (QString *__return_storage_ptr__,QWidget *parent,QString *title,QString *label,
                    EchoMode mode,QString *text,bool *ok,WindowFlags flags,
                    InputMethodHints inputMethodHints)

{
  QInputDialogPrivate *this;
  long lVar1;
  Data *pDVar2;
  int iVar3;
  QWidget *this_00;
  long in_FS_OFFSET;
  bool bVar4;
  QAutoPointer<QInputDialog> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)this_00,parent,flags);
  local_48.o.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
  local_48.o.wp.value = (QObject *)this_00;
  QWidget::setWindowTitle(this_00,title);
  setLabelText((QInputDialog *)local_48.o.wp.value,label);
  setTextValue((QInputDialog *)local_48.o.wp.value,text);
  this = *(QInputDialogPrivate **)((long)local_48.o.wp.value + 8);
  QInputDialogPrivate::ensureLineEdit(this);
  QLineEdit::setEchoMode(this->lineEdit,mode);
  QWidget::setInputMethodHints((QWidget *)local_48.o.wp.value,inputMethodHints);
  iVar3 = (**(code **)(*(long *)local_48.o.wp.value + 0x1a8))();
  if (ok != (bool *)0x0) {
    *ok = iVar3 != 0;
  }
  if ((local_48.o.wp.d == (Data *)0x0) || (*(int *)(local_48.o.wp.d + 4) == 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = (QWidget *)local_48.o.wp.value != (QWidget *)0x0;
  }
  if ((iVar3 == 0) || (!bVar4)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = *(long *)((long)local_48.o.wp.value + 8);
    pDVar2 = *(Data **)(lVar1 + 0x338);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x340);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x348);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QInputDialog::getText(QWidget *parent, const QString &title, const QString &label,
                              QLineEdit::EchoMode mode, const QString &text, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setTextValue(text);
    dialog->setTextEchoMode(mode);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return QString();
    }
}